

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O1

void __thiscall ThreadPool::clear(ThreadPool *this)

{
  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *plVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _List_node_base *p_Var4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskInfo);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  plVar1 = &this->_task;
  for (p_Var4 = (this->_task).
                super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)plVar1;
      p_Var4 = p_Var4->_M_next) {
    (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x10))(p_Var4[1]._M_next,1);
  }
  p_Var4 = (plVar1->
           super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var2;
  }
  (this->_task).super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->_task).super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->_task).super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
  _M_impl._M_node._M_size = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
  return;
}

Assistant:

void ThreadPool::clear()
{
    _taskInfo.lock();
    // complete all tasks without real computations. It helps to avoid a deadlock in a case when thread pool is destroyed
    std::for_each( _task.begin(), _task.end(), []( AbstractTaskProvider * task ) { task->_task( true ); } );
    _task.clear();

    _taskInfo.unlock();
}